

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

void secp256k1_ge_set_gej_zinv(secp256k1_ge *r,secp256k1_gej *a,secp256k1_fe *zi)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  ulong uVar234;
  ulong uVar235;
  ulong uVar236;
  ulong uVar237;
  ulong uVar238;
  ulong uVar239;
  ulong uVar240;
  ulong uVar241;
  ulong uVar242;
  ulong uVar243;
  ulong uVar244;
  ulong uVar245;
  ulong uVar246;
  ulong uVar247;
  ulong uVar248;
  ulong uVar249;
  ulong uVar250;
  ulong uVar251;
  uint64_t tmp3;
  uint64_t tmp2;
  uint64_t tmp3_1;
  secp256k1_fe zi3;
  secp256k1_fe zi2;
  
  uVar244 = zi->n[0];
  uVar247 = zi->n[1];
  uVar239 = zi->n[2];
  uVar249 = zi->n[3];
  uVar1 = zi->n[4];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar244 * 2;
  auVar112._8_8_ = 0;
  auVar112._0_8_ = uVar249;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar247 * 2;
  auVar113._8_8_ = 0;
  auVar113._0_8_ = uVar239;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar1;
  auVar114._8_8_ = 0;
  auVar114._0_8_ = uVar1;
  uVar234 = SUB168(auVar4 * auVar114,0);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar234 & 0xfffffffffffff;
  auVar2 = auVar3 * auVar113 + auVar2 * auVar112 + auVar5 * ZEXT816(0x1000003d10);
  uVar242 = auVar2._0_8_;
  auVar206._8_8_ = 0;
  auVar206._0_8_ = uVar242 >> 0x34 | auVar2._8_8_ << 0xc;
  uVar1 = uVar1 * 2;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar244;
  auVar115._8_8_ = 0;
  auVar115._0_8_ = uVar1;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar247 * 2;
  auVar116._8_8_ = 0;
  auVar116._0_8_ = uVar249;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar239;
  auVar117._8_8_ = 0;
  auVar117._0_8_ = uVar239;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar234 >> 0x34 | SUB168(auVar4 * auVar114,8) << 0xc;
  auVar2 = auVar6 * auVar115 + auVar206 + auVar7 * auVar116 + auVar8 * auVar117 +
           auVar9 * ZEXT816(0x1000003d10);
  uVar243 = auVar2._0_8_;
  auVar207._8_8_ = 0;
  auVar207._0_8_ = uVar243 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar244;
  auVar118._8_8_ = 0;
  auVar118._0_8_ = uVar244;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar247;
  auVar119._8_8_ = 0;
  auVar119._0_8_ = uVar1;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar239 * 2;
  auVar120._8_8_ = 0;
  auVar120._0_8_ = uVar249;
  auVar2 = auVar11 * auVar119 + auVar207 + auVar12 * auVar120;
  uVar234 = auVar2._0_8_;
  auVar209._8_8_ = 0;
  auVar209._0_8_ = uVar234 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar121._8_8_ = 0;
  auVar121._0_8_ = (uVar234 & 0xfffffffffffff) << 4 | (uVar243 & 0xfffffffffffff) >> 0x30;
  auVar2 = auVar10 * auVar118 + ZEXT816(0x1000003d1) * auVar121;
  uVar245 = auVar2._0_8_;
  uVar234 = uVar245 & 0xfffffffffffff;
  auVar208._8_8_ = 0;
  auVar208._0_8_ = uVar245 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar244 * 2;
  auVar122._8_8_ = 0;
  auVar122._0_8_ = uVar247;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar239;
  auVar123._8_8_ = 0;
  auVar123._0_8_ = uVar1;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar249;
  auVar124._8_8_ = 0;
  auVar124._0_8_ = uVar249;
  auVar3 = auVar14 * auVar123 + auVar209 + auVar15 * auVar124;
  uVar245 = auVar3._0_8_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar245 & 0xfffffffffffff;
  auVar2 = auVar13 * auVar122 + auVar208 + auVar16 * ZEXT816(0x1000003d10);
  uVar246 = auVar2._0_8_;
  auVar211._8_8_ = 0;
  auVar211._0_8_ = uVar245 >> 0x34 | auVar3._8_8_ << 0xc;
  uVar245 = uVar246 & 0xfffffffffffff;
  auVar210._8_8_ = 0;
  auVar210._0_8_ = uVar246 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar244 * 2;
  auVar125._8_8_ = 0;
  auVar125._0_8_ = uVar239;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar247;
  auVar126._8_8_ = 0;
  auVar126._0_8_ = uVar247;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar249;
  auVar127._8_8_ = 0;
  auVar127._0_8_ = uVar1;
  auVar211 = auVar19 * auVar127 + auVar211;
  uVar244 = auVar211._0_8_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar244 & 0xfffffffffffff;
  auVar2 = auVar17 * auVar125 + auVar210 + auVar18 * auVar126 + auVar20 * ZEXT816(0x1000003d10);
  uVar247 = auVar2._0_8_;
  uVar246 = uVar247 & 0xfffffffffffff;
  auVar212._8_8_ = 0;
  auVar212._0_8_ = (uVar247 >> 0x34 | auVar2._8_8_ << 0xc) + (uVar242 & 0xfffffffffffff);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = uVar244 >> 0x34 | auVar211._8_8_ << 0xc;
  auVar212 = auVar21 * ZEXT816(0x1000003d10) + auVar212;
  uVar244 = auVar212._0_8_;
  uVar242 = uVar244 & 0xfffffffffffff;
  uVar248 = (uVar244 >> 0x34 | auVar212._8_8_ << 0xc) + (uVar243 & 0xffffffffffff);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = zi->n[0];
  auVar128._8_8_ = 0;
  auVar128._0_8_ = uVar242;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = zi->n[1];
  auVar129._8_8_ = 0;
  auVar129._0_8_ = uVar246;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = zi->n[2];
  auVar130._8_8_ = 0;
  auVar130._0_8_ = uVar245;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = zi->n[3];
  auVar131._8_8_ = 0;
  auVar131._0_8_ = uVar234;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = zi->n[4];
  auVar132._8_8_ = 0;
  auVar132._0_8_ = uVar248;
  uVar244 = SUB168(auVar26 * auVar132,0);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uVar244 & 0xfffffffffffff;
  auVar2 = auVar23 * auVar129 + auVar22 * auVar128 + auVar24 * auVar130 + auVar25 * auVar131 +
           auVar27 * ZEXT816(0x1000003d10);
  uVar247 = auVar2._0_8_;
  auVar213._8_8_ = 0;
  auVar213._0_8_ = uVar247 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = zi->n[0];
  auVar133._8_8_ = 0;
  auVar133._0_8_ = uVar248;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = zi->n[1];
  auVar134._8_8_ = 0;
  auVar134._0_8_ = uVar242;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = zi->n[2];
  auVar135._8_8_ = 0;
  auVar135._0_8_ = uVar246;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = zi->n[3];
  auVar136._8_8_ = 0;
  auVar136._0_8_ = uVar245;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = zi->n[4];
  auVar137._8_8_ = 0;
  auVar137._0_8_ = uVar234;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = uVar244 >> 0x34 | SUB168(auVar26 * auVar132,8) << 0xc;
  auVar2 = auVar28 * auVar133 + auVar213 + auVar29 * auVar134 + auVar30 * auVar135 +
           auVar31 * auVar136 + auVar32 * auVar137 + auVar33 * ZEXT816(0x1000003d10);
  uVar244 = auVar2._0_8_;
  auVar214._8_8_ = 0;
  auVar214._0_8_ = uVar244 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = zi->n[0];
  auVar138._8_8_ = 0;
  auVar138._0_8_ = uVar234;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = zi->n[1];
  auVar139._8_8_ = 0;
  auVar139._0_8_ = uVar248;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = zi->n[2];
  auVar140._8_8_ = 0;
  auVar140._0_8_ = uVar242;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = zi->n[3];
  auVar141._8_8_ = 0;
  auVar141._0_8_ = uVar246;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = zi->n[4];
  auVar142._8_8_ = 0;
  auVar142._0_8_ = uVar245;
  auVar2 = auVar35 * auVar139 + auVar214 + auVar36 * auVar140 + auVar37 * auVar141 +
           auVar38 * auVar142;
  uVar239 = auVar2._0_8_;
  auVar216._8_8_ = 0;
  auVar216._0_8_ = uVar239 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar143._8_8_ = 0;
  auVar143._0_8_ = (uVar239 & 0xfffffffffffff) << 4 | (uVar244 & 0xfffffffffffff) >> 0x30;
  auVar2 = auVar34 * auVar138 + ZEXT816(0x1000003d1) * auVar143;
  uVar239 = auVar2._0_8_;
  uVar243 = uVar239 & 0xfffffffffffff;
  auVar215._8_8_ = 0;
  auVar215._0_8_ = uVar239 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = zi->n[0];
  auVar144._8_8_ = 0;
  auVar144._0_8_ = uVar245;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = zi->n[1];
  auVar145._8_8_ = 0;
  auVar145._0_8_ = uVar234;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = zi->n[2];
  auVar146._8_8_ = 0;
  auVar146._0_8_ = uVar248;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = zi->n[3];
  auVar147._8_8_ = 0;
  auVar147._0_8_ = uVar242;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = zi->n[4];
  auVar148._8_8_ = 0;
  auVar148._0_8_ = uVar246;
  auVar3 = auVar41 * auVar146 + auVar216 + auVar42 * auVar147 + auVar43 * auVar148;
  uVar239 = auVar3._0_8_;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = uVar239 & 0xfffffffffffff;
  auVar2 = auVar39 * auVar144 + auVar215 + auVar40 * auVar145 + auVar44 * ZEXT816(0x1000003d10);
  uVar249 = auVar2._0_8_;
  auVar218._8_8_ = 0;
  auVar218._0_8_ = uVar239 >> 0x34 | auVar3._8_8_ << 0xc;
  uVar235 = uVar249 & 0xfffffffffffff;
  auVar217._8_8_ = 0;
  auVar217._0_8_ = uVar249 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = zi->n[0];
  auVar149._8_8_ = 0;
  auVar149._0_8_ = uVar246;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = zi->n[1];
  auVar150._8_8_ = 0;
  auVar150._0_8_ = uVar245;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = zi->n[2];
  auVar151._8_8_ = 0;
  auVar151._0_8_ = uVar234;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = zi->n[3];
  auVar152._8_8_ = 0;
  auVar152._0_8_ = uVar248;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = zi->n[4];
  auVar153._8_8_ = 0;
  auVar153._0_8_ = uVar242;
  auVar3 = auVar48 * auVar152 + auVar218 + auVar49 * auVar153;
  uVar239 = auVar3._0_8_;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = uVar239 & 0xfffffffffffff;
  auVar2 = auVar45 * auVar149 + auVar217 + auVar46 * auVar150 + auVar47 * auVar151 +
           auVar50 * ZEXT816(0x1000003d10);
  uVar249 = auVar2._0_8_;
  uVar236 = uVar249 & 0xfffffffffffff;
  auVar219._8_8_ = 0;
  auVar219._0_8_ = (uVar249 >> 0x34 | auVar2._8_8_ << 0xc) + (uVar247 & 0xfffffffffffff);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = uVar239 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar219 = auVar51 * ZEXT816(0x1000003d10) + auVar219;
  uVar247 = auVar219._0_8_;
  uVar237 = uVar247 & 0xfffffffffffff;
  uVar250 = (uVar247 >> 0x34 | auVar219._8_8_ << 0xc) + (uVar244 & 0xffffffffffff);
  uVar244 = (a->x).n[0];
  uVar247 = (a->x).n[1];
  uVar239 = (a->x).n[2];
  uVar249 = (a->x).n[3];
  uVar1 = (a->x).n[4];
  auVar52._8_8_ = 0;
  auVar52._0_8_ = uVar234;
  auVar154._8_8_ = 0;
  auVar154._0_8_ = uVar249;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = uVar245;
  auVar155._8_8_ = 0;
  auVar155._0_8_ = uVar239;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = uVar246;
  auVar156._8_8_ = 0;
  auVar156._0_8_ = uVar247;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = uVar242;
  auVar157._8_8_ = 0;
  auVar157._0_8_ = uVar244;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = uVar248;
  auVar158._8_8_ = 0;
  auVar158._0_8_ = uVar1;
  uVar238 = SUB168(auVar56 * auVar158,0);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = uVar238 & 0xfffffffffffff;
  auVar2 = auVar53 * auVar155 + auVar52 * auVar154 + auVar54 * auVar156 + auVar55 * auVar157 +
           auVar57 * ZEXT816(0x1000003d10);
  uVar240 = auVar2._0_8_;
  auVar220._8_8_ = 0;
  auVar220._0_8_ = uVar240 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = uVar234;
  auVar159._8_8_ = 0;
  auVar159._0_8_ = uVar1;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = uVar245;
  auVar160._8_8_ = 0;
  auVar160._0_8_ = uVar249;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = uVar246;
  auVar161._8_8_ = 0;
  auVar161._0_8_ = uVar239;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = uVar242;
  auVar162._8_8_ = 0;
  auVar162._0_8_ = uVar247;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = uVar248;
  auVar163._8_8_ = 0;
  auVar163._0_8_ = uVar244;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = uVar238 >> 0x34 | SUB168(auVar56 * auVar158,8) << 0xc;
  auVar2 = auVar58 * auVar159 + auVar220 + auVar59 * auVar160 + auVar60 * auVar161 +
           auVar61 * auVar162 + auVar62 * auVar163 + auVar63 * ZEXT816(0x1000003d10);
  uVar238 = auVar2._0_8_;
  auVar221._8_8_ = 0;
  auVar221._0_8_ = uVar238 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = uVar234;
  auVar164._8_8_ = 0;
  auVar164._0_8_ = uVar244;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = uVar245;
  auVar165._8_8_ = 0;
  auVar165._0_8_ = uVar1;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = uVar246;
  auVar166._8_8_ = 0;
  auVar166._0_8_ = uVar249;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = uVar242;
  auVar167._8_8_ = 0;
  auVar167._0_8_ = uVar239;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = uVar248;
  auVar168._8_8_ = 0;
  auVar168._0_8_ = uVar247;
  auVar2 = auVar65 * auVar165 + auVar221 + auVar66 * auVar166 + auVar67 * auVar167 +
           auVar68 * auVar168;
  uVar241 = auVar2._0_8_;
  auVar223._8_8_ = 0;
  auVar223._0_8_ = uVar241 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar169._8_8_ = 0;
  auVar169._0_8_ = (uVar241 & 0xfffffffffffff) << 4 | (uVar238 & 0xfffffffffffff) >> 0x30;
  auVar2 = auVar64 * auVar164 + ZEXT816(0x1000003d1) * auVar169;
  uVar241 = auVar2._0_8_;
  (r->x).n[0] = uVar241 & 0xfffffffffffff;
  auVar222._8_8_ = 0;
  auVar222._0_8_ = uVar241 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = uVar234;
  auVar170._8_8_ = 0;
  auVar170._0_8_ = uVar247;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = uVar245;
  auVar171._8_8_ = 0;
  auVar171._0_8_ = uVar244;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = uVar246;
  auVar172._8_8_ = 0;
  auVar172._0_8_ = uVar1;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = uVar242;
  auVar173._8_8_ = 0;
  auVar173._0_8_ = uVar249;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = uVar248;
  auVar174._8_8_ = 0;
  auVar174._0_8_ = uVar239;
  auVar3 = auVar71 * auVar172 + auVar223 + auVar72 * auVar173 + auVar73 * auVar174;
  uVar241 = auVar3._0_8_;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = uVar241 & 0xfffffffffffff;
  auVar2 = auVar69 * auVar170 + auVar222 + auVar70 * auVar171 + auVar74 * ZEXT816(0x1000003d10);
  uVar251 = auVar2._0_8_;
  auVar225._8_8_ = 0;
  auVar225._0_8_ = uVar241 >> 0x34 | auVar3._8_8_ << 0xc;
  (r->x).n[1] = uVar251 & 0xfffffffffffff;
  auVar224._8_8_ = 0;
  auVar224._0_8_ = uVar251 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = uVar234;
  auVar175._8_8_ = 0;
  auVar175._0_8_ = uVar239;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = uVar245;
  auVar176._8_8_ = 0;
  auVar176._0_8_ = uVar247;
  auVar77._8_8_ = 0;
  auVar77._0_8_ = uVar246;
  auVar177._8_8_ = 0;
  auVar177._0_8_ = uVar244;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = uVar242;
  auVar178._8_8_ = 0;
  auVar178._0_8_ = uVar1;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = uVar248;
  auVar179._8_8_ = 0;
  auVar179._0_8_ = uVar249;
  auVar3 = auVar78 * auVar178 + auVar225 + auVar79 * auVar179;
  uVar244 = auVar3._0_8_;
  auVar80._8_8_ = 0;
  auVar80._0_8_ = uVar244 & 0xfffffffffffff;
  auVar2 = auVar75 * auVar175 + auVar224 + auVar76 * auVar176 + auVar77 * auVar177 +
           auVar80 * ZEXT816(0x1000003d10);
  uVar247 = auVar2._0_8_;
  (r->x).n[2] = uVar247 & 0xfffffffffffff;
  auVar226._8_8_ = 0;
  auVar226._0_8_ = (uVar247 >> 0x34 | auVar2._8_8_ << 0xc) + (uVar240 & 0xfffffffffffff);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = uVar244 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar226 = auVar81 * ZEXT816(0x1000003d10) + auVar226;
  uVar244 = auVar226._0_8_;
  (r->x).n[3] = uVar244 & 0xfffffffffffff;
  (r->x).n[4] = (uVar244 >> 0x34 | auVar226._8_8_ << 0xc) + (uVar238 & 0xffffffffffff);
  uVar244 = (a->y).n[0];
  uVar247 = (a->y).n[1];
  uVar239 = (a->y).n[2];
  uVar249 = (a->y).n[3];
  uVar1 = (a->y).n[4];
  auVar82._8_8_ = 0;
  auVar82._0_8_ = uVar243;
  auVar180._8_8_ = 0;
  auVar180._0_8_ = uVar249;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = uVar235;
  auVar181._8_8_ = 0;
  auVar181._0_8_ = uVar239;
  auVar84._8_8_ = 0;
  auVar84._0_8_ = uVar236;
  auVar182._8_8_ = 0;
  auVar182._0_8_ = uVar247;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = uVar237;
  auVar183._8_8_ = 0;
  auVar183._0_8_ = uVar244;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = uVar250;
  auVar184._8_8_ = 0;
  auVar184._0_8_ = uVar1;
  uVar234 = SUB168(auVar86 * auVar184,0);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = uVar234 & 0xfffffffffffff;
  auVar2 = auVar83 * auVar181 + auVar82 * auVar180 + auVar84 * auVar182 + auVar85 * auVar183 +
           auVar87 * ZEXT816(0x1000003d10);
  uVar245 = auVar2._0_8_;
  auVar227._8_8_ = 0;
  auVar227._0_8_ = uVar245 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = uVar243;
  auVar185._8_8_ = 0;
  auVar185._0_8_ = uVar1;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = uVar235;
  auVar186._8_8_ = 0;
  auVar186._0_8_ = uVar249;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = uVar236;
  auVar187._8_8_ = 0;
  auVar187._0_8_ = uVar239;
  auVar91._8_8_ = 0;
  auVar91._0_8_ = uVar237;
  auVar188._8_8_ = 0;
  auVar188._0_8_ = uVar247;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = uVar250;
  auVar189._8_8_ = 0;
  auVar189._0_8_ = uVar244;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = uVar234 >> 0x34 | SUB168(auVar86 * auVar184,8) << 0xc;
  auVar2 = auVar88 * auVar185 + auVar227 + auVar89 * auVar186 + auVar90 * auVar187 +
           auVar91 * auVar188 + auVar92 * auVar189 + auVar93 * ZEXT816(0x1000003d10);
  uVar234 = auVar2._0_8_;
  auVar228._8_8_ = 0;
  auVar228._0_8_ = uVar234 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = uVar243;
  auVar190._8_8_ = 0;
  auVar190._0_8_ = uVar244;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = uVar235;
  auVar191._8_8_ = 0;
  auVar191._0_8_ = uVar1;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = uVar236;
  auVar192._8_8_ = 0;
  auVar192._0_8_ = uVar249;
  auVar97._8_8_ = 0;
  auVar97._0_8_ = uVar237;
  auVar193._8_8_ = 0;
  auVar193._0_8_ = uVar239;
  auVar98._8_8_ = 0;
  auVar98._0_8_ = uVar250;
  auVar194._8_8_ = 0;
  auVar194._0_8_ = uVar247;
  auVar2 = auVar95 * auVar191 + auVar228 + auVar96 * auVar192 + auVar97 * auVar193 +
           auVar98 * auVar194;
  uVar246 = auVar2._0_8_;
  auVar230._8_8_ = 0;
  auVar230._0_8_ = uVar246 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar195._8_8_ = 0;
  auVar195._0_8_ = (uVar246 & 0xfffffffffffff) << 4 | (uVar234 & 0xfffffffffffff) >> 0x30;
  auVar2 = auVar94 * auVar190 + ZEXT816(0x1000003d1) * auVar195;
  uVar246 = auVar2._0_8_;
  (r->y).n[0] = uVar246 & 0xfffffffffffff;
  auVar229._8_8_ = 0;
  auVar229._0_8_ = uVar246 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar99._8_8_ = 0;
  auVar99._0_8_ = uVar243;
  auVar196._8_8_ = 0;
  auVar196._0_8_ = uVar247;
  auVar100._8_8_ = 0;
  auVar100._0_8_ = uVar235;
  auVar197._8_8_ = 0;
  auVar197._0_8_ = uVar244;
  auVar101._8_8_ = 0;
  auVar101._0_8_ = uVar236;
  auVar198._8_8_ = 0;
  auVar198._0_8_ = uVar1;
  auVar102._8_8_ = 0;
  auVar102._0_8_ = uVar237;
  auVar199._8_8_ = 0;
  auVar199._0_8_ = uVar249;
  auVar103._8_8_ = 0;
  auVar103._0_8_ = uVar250;
  auVar200._8_8_ = 0;
  auVar200._0_8_ = uVar239;
  auVar3 = auVar101 * auVar198 + auVar230 + auVar102 * auVar199 + auVar103 * auVar200;
  uVar246 = auVar3._0_8_;
  auVar104._8_8_ = 0;
  auVar104._0_8_ = uVar246 & 0xfffffffffffff;
  auVar2 = auVar99 * auVar196 + auVar229 + auVar100 * auVar197 + auVar104 * ZEXT816(0x1000003d10);
  uVar242 = auVar2._0_8_;
  auVar232._8_8_ = 0;
  auVar232._0_8_ = uVar246 >> 0x34 | auVar3._8_8_ << 0xc;
  (r->y).n[1] = uVar242 & 0xfffffffffffff;
  auVar231._8_8_ = 0;
  auVar231._0_8_ = uVar242 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar105._8_8_ = 0;
  auVar105._0_8_ = uVar243;
  auVar201._8_8_ = 0;
  auVar201._0_8_ = uVar239;
  auVar106._8_8_ = 0;
  auVar106._0_8_ = uVar235;
  auVar202._8_8_ = 0;
  auVar202._0_8_ = uVar247;
  auVar107._8_8_ = 0;
  auVar107._0_8_ = uVar236;
  auVar203._8_8_ = 0;
  auVar203._0_8_ = uVar244;
  auVar108._8_8_ = 0;
  auVar108._0_8_ = uVar237;
  auVar204._8_8_ = 0;
  auVar204._0_8_ = uVar1;
  auVar109._8_8_ = 0;
  auVar109._0_8_ = uVar250;
  auVar205._8_8_ = 0;
  auVar205._0_8_ = uVar249;
  auVar3 = auVar108 * auVar204 + auVar232 + auVar109 * auVar205;
  uVar244 = auVar3._0_8_;
  auVar110._8_8_ = 0;
  auVar110._0_8_ = uVar244 & 0xfffffffffffff;
  auVar2 = auVar105 * auVar201 + auVar231 + auVar106 * auVar202 + auVar107 * auVar203 +
           auVar110 * ZEXT816(0x1000003d10);
  uVar247 = auVar2._0_8_;
  (r->y).n[2] = uVar247 & 0xfffffffffffff;
  auVar233._8_8_ = 0;
  auVar233._0_8_ = (uVar247 >> 0x34 | auVar2._8_8_ << 0xc) + (uVar245 & 0xfffffffffffff);
  auVar111._8_8_ = 0;
  auVar111._0_8_ = uVar244 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar233 = auVar111 * ZEXT816(0x1000003d10) + auVar233;
  uVar244 = auVar233._0_8_;
  (r->y).n[3] = uVar244 & 0xfffffffffffff;
  (r->y).n[4] = (uVar244 >> 0x34 | auVar233._8_8_ << 0xc) + (uVar234 & 0xffffffffffff);
  r->infinity = a->infinity;
  return;
}

Assistant:

static void secp256k1_ge_set_gej_zinv(secp256k1_ge *r, const secp256k1_gej *a, const secp256k1_fe *zi) {
    secp256k1_fe zi2;
    secp256k1_fe zi3;
    VERIFY_CHECK(!a->infinity);
    secp256k1_fe_sqr(&zi2, zi);
    secp256k1_fe_mul(&zi3, &zi2, zi);
    secp256k1_fe_mul(&r->x, &a->x, &zi2);
    secp256k1_fe_mul(&r->y, &a->y, &zi3);
    r->infinity = a->infinity;
}